

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

KeyData * __thiscall
cfd::core::Psbt::GetTxInKeyData
          (KeyData *__return_storage_ptr__,Psbt *this,uint32_t index,bool ignore_error)

{
  CfdException *this_00;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> keys;
  undefined1 local_58 [32];
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_38;
  
  GetTxInKeyDataList(&local_38,this,index);
  if (local_38.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_38.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (!ignore_error) {
      local_58._0_8_ = "cfdcore_psbt.cpp";
      local_58._8_4_ = 0xa8b;
      local_58._16_8_ = "GetTxInKeyData";
      logger::log<>((CfdSourceLocation *)local_58,kCfdLogLevelWarning,"key not found.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_58._0_8_ = local_58 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,"psbt key not found error.","");
      CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_58);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    KeyData::KeyData(__return_storage_ptr__);
  }
  else {
    KeyData::KeyData(__return_storage_ptr__,
                     local_38.
                     super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  }
  ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

KeyData Psbt::GetTxInKeyData(uint32_t index, bool ignore_error) const {
  std::vector<KeyData> keys = GetTxInKeyDataList(index);
  if (!keys.empty()) {
    return keys[0];
  } else if (ignore_error) {
    return KeyData();
  } else {
    warn(CFD_LOG_SOURCE, "key not found.");
    throw CfdException(kCfdIllegalStateError, "psbt key not found error.");
  }
}